

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawFile.cpp
# Opt level: O0

void __thiscall RawFile::write<unsigned_int>(RawFile *this,uint *buf,size_t count)

{
  ssize_t sVar1;
  runtime_error *this_00;
  long in_RDX;
  void *in_RSI;
  int *in_RDI;
  ssize_t result;
  uint64_t to_write;
  char *buf_raw;
  size_t local_28;
  void *local_20;
  
  local_28 = in_RDX << 2;
  local_20 = in_RSI;
  while( true ) {
    if (local_28 == 0) {
      return;
    }
    sVar1 = ::write(*in_RDI,local_20,local_28);
    if (sVar1 < 0) break;
    local_20 = (void *)(sVar1 + (long)local_20);
    local_28 = local_28 - sVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"RawFile::write: write failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void RawFile::write(const T *buf, size_t count) {
    const auto *buf_raw = reinterpret_cast<const char *>(buf);
    uint64_t to_write = count * sizeof(T);
    while (to_write > 0) {
        ssize_t result = ::write(fd, buf_raw, to_write);
        if (result < 0) {
            throw std::runtime_error("RawFile::write: write failed");
        }
        buf_raw += result;
        to_write -= result;
    }
}